

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O3

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CEseqFloatVisitor::processRightEseqInCJump
          (CEseqFloatVisitor *this,CJumpConditionalStatement *cjump,CExpression *left,
          CEseqExpression *rightEseq)

{
  undefined8 uVar1;
  CSeqStatement *pCVar2;
  bool bVar3;
  TLogicOperator TVar4;
  CStatement *pCVar5;
  CJumpConditionalStatement *pCVar6;
  CExpression *pCVar7;
  CMoveStatement *this_00;
  CTempExpression *pCVar8;
  CMemExpression *this_01;
  CEseqExpression *in_R8;
  CTemp temp;
  undefined1 local_120 [16];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_f8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_f0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_e8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_e0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_d8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_d0;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_c8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_c0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_b8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_b0;
  undefined1 local_a8 [24];
  undefined1 local_90 [16];
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_80;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_78;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_70;
  CJumpConditionalStatement *local_68;
  CSeqStatement *local_60;
  undefined1 local_58 [32];
  CMoveStatement *local_38;
  
  pCVar5 = CEseqExpression::getStatement(in_R8);
  bVar3 = isExpCommuteWithStm(&rightEseq->super_CExpression,pCVar5);
  if (bVar3) {
    local_108._8_8_ = operator_new(0x18);
    pCVar5 = CEseqExpression::getStatement(in_R8);
    (*(pCVar5->super_IStatement).super_INode._vptr_INode[3])(local_58,pCVar5);
    local_b0._M_head_impl = (CStatement *)local_58._0_8_;
    local_58._0_8_ = (long *)0x0;
    pCVar6 = (CJumpConditionalStatement *)operator_new(0x30);
    TVar4 = CJumpConditionalStatement::Operation((CJumpConditionalStatement *)left);
    (*(rightEseq->super_CExpression).super_IExpression.super_INode._vptr_INode[3])
              (&local_108,rightEseq);
    local_b8._M_head_impl = (CExpression *)local_108._M_allocated_capacity;
    local_108._M_allocated_capacity = 0;
    pCVar7 = CEseqExpression::getExpression(in_R8);
    (*(pCVar7->super_IExpression).super_INode._vptr_INode[3])(&local_110,pCVar7);
    local_c0._M_head_impl = (CExpression *)local_110._M_p;
    local_110._M_p = (pointer)0x0;
    CJumpConditionalStatement::TrueLabel((CJumpConditionalStatement *)left);
    CLabelStatement::CastCopy((CLabelStatement *)(local_120 + 8));
    local_c8._M_head_impl = (CLabelStatement *)local_120._8_8_;
    local_120._8_8_ = (long *)0x0;
    CJumpConditionalStatement::FalseLabel((CJumpConditionalStatement *)left);
    CLabelStatement::CastCopy((CLabelStatement *)local_120);
    local_78._M_head_impl = (CLabelStatement *)local_120._0_8_;
    local_120._0_8_ = (_func_int **)0x0;
    CJumpConditionalStatement::CJumpConditionalStatement
              (pCVar6,TVar4,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_b8,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_c0,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)&local_c8,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)&local_78);
    uVar1 = local_108._8_8_;
    local_70._M_head_impl = (CStatement *)pCVar6;
    CSeqStatement::CSeqStatement
              ((CSeqStatement *)local_108._8_8_,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_b0,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_70);
    (this->super_IVisitor)._vptr_IVisitor = (_func_int **)uVar1;
    if ((CJumpConditionalStatement *)local_70._M_head_impl != (CJumpConditionalStatement *)0x0) {
      (*((INode *)&((local_70._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_70._M_head_impl = (CStatement *)0x0;
    if (local_78._M_head_impl != (CLabelStatement *)0x0) {
      (*((local_78._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
    }
    local_78._M_head_impl = (CLabelStatement *)0x0;
    if ((_func_int **)local_120._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_120._0_8_ + 0x10))();
    }
    if (local_c8._M_head_impl != (CLabelStatement *)0x0) {
      (*((local_c8._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
    }
    local_c8._M_head_impl = (CLabelStatement *)0x0;
    if ((long *)local_120._8_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_120._8_8_ + 0x10))();
    }
    if (local_c0._M_head_impl != (CExpression *)0x0) {
      (*((local_c0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_c0._M_head_impl = (CExpression *)0x0;
    if ((long *)local_110._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_110._M_p + 0x10))();
    }
    if (local_b8._M_head_impl != (CExpression *)0x0) {
      (*((local_b8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_b8._M_head_impl = (CExpression *)0x0;
    if ((long *)local_108._M_allocated_capacity != (long *)0x0) {
      (**(code **)(*(long *)local_108._M_allocated_capacity + 0x10))();
    }
    if (local_b0._M_head_impl != (CStatement *)0x0) {
      (*((local_b0._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_b0._M_head_impl = (CStatement *)0x0;
    if ((long *)local_58._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_58._0_8_ + 0x10))();
    }
  }
  else {
    CTemp::CTemp((CTemp *)local_58);
    local_108._8_8_ = operator_new(0x18);
    this_00 = (CMoveStatement *)operator_new(0x18);
    local_38 = this_00;
    pCVar8 = (CTempExpression *)operator_new(0x28);
    CTempExpression::CTempExpression(pCVar8,(CTemp *)local_58);
    local_d8._M_head_impl = (CExpression *)pCVar8;
    (*(rightEseq->super_CExpression).super_IExpression.super_INode._vptr_INode[3])
              (&local_108,rightEseq);
    local_80._M_head_impl = (CExpression *)local_108._M_allocated_capacity;
    local_108._M_allocated_capacity = 0;
    CMoveStatement::CMoveStatement
              (this_00,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        *)&local_d8,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_80);
    local_d0._M_head_impl = (CStatement *)this_00;
    local_60 = (CSeqStatement *)operator_new(0x18);
    pCVar5 = CEseqExpression::getStatement(in_R8);
    (*(pCVar5->super_IStatement).super_INode._vptr_INode[3])(&local_110,pCVar5);
    local_e0._M_head_impl = (CStatement *)local_110._M_p;
    local_110._M_p = (pointer)0x0;
    local_68 = (CJumpConditionalStatement *)operator_new(0x30);
    TVar4 = CJumpConditionalStatement::Operation((CJumpConditionalStatement *)left);
    this_01 = (CMemExpression *)operator_new(0x10);
    pCVar8 = (CTempExpression *)operator_new(0x28);
    CTempExpression::CTempExpression(pCVar8,(CTemp *)local_58);
    local_a8._16_8_ = pCVar8;
    CMemExpression::CMemExpression
              (this_01,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        *)(local_a8 + 0x10));
    local_e8._M_head_impl = (CExpression *)this_01;
    pCVar7 = CEseqExpression::getExpression(in_R8);
    (*(pCVar7->super_IExpression).super_INode._vptr_INode[3])(local_120 + 8,pCVar7);
    local_f0._M_head_impl = (CExpression *)local_120._8_8_;
    local_120._8_8_ = (long *)0x0;
    CJumpConditionalStatement::TrueLabel((CJumpConditionalStatement *)left);
    CLabelStatement::CastCopy((CLabelStatement *)local_120);
    local_f8._M_head_impl = (CLabelStatement *)local_120._0_8_;
    local_120._0_8_ = (_func_int **)0x0;
    CJumpConditionalStatement::FalseLabel((CJumpConditionalStatement *)left);
    CLabelStatement::CastCopy((CLabelStatement *)local_a8);
    pCVar6 = local_68;
    local_a8._8_8_ = local_a8._0_8_;
    local_a8._0_8_ = (_func_int **)0x0;
    CJumpConditionalStatement::CJumpConditionalStatement
              (local_68,TVar4,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_e8,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_f0,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)&local_f8,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_a8 + 8));
    pCVar2 = local_60;
    uVar1 = local_108._8_8_;
    local_90._0_8_ = pCVar6;
    CSeqStatement::CSeqStatement
              (local_60,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                         *)&local_e0,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               local_90);
    local_90._8_8_ = pCVar2;
    CSeqStatement::CSeqStatement
              ((CSeqStatement *)uVar1,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_d0,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               (local_90 + 8));
    (this->super_IVisitor)._vptr_IVisitor = (_func_int **)uVar1;
    if ((CSeqStatement *)local_90._8_8_ != (CSeqStatement *)0x0) {
      (**(code **)(*(long *)local_90._8_8_ + 0x10))();
    }
    local_90._8_8_ = 0;
    if ((CJumpConditionalStatement *)local_90._0_8_ != (CJumpConditionalStatement *)0x0) {
      (**(code **)(*(long *)local_90._0_8_ + 0x10))();
    }
    local_90._0_8_ = 0;
    if ((_func_int **)local_a8._8_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_a8._8_8_ + 0x10))();
    }
    local_a8._8_8_ = (pointer)0x0;
    if ((_func_int **)local_a8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_a8._0_8_ + 0x10))();
    }
    if (local_f8._M_head_impl != (CLabelStatement *)0x0) {
      (*((local_f8._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
    }
    local_f8._M_head_impl = (CLabelStatement *)0x0;
    if ((_func_int **)local_120._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_120._0_8_ + 0x10))();
    }
    if (local_f0._M_head_impl != (CExpression *)0x0) {
      (*((local_f0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_f0._M_head_impl = (CExpression *)0x0;
    if ((long *)local_120._8_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_120._8_8_ + 0x10))();
    }
    if ((CMemExpression *)local_e8._M_head_impl != (CMemExpression *)0x0) {
      (*(((CExpression *)&(local_e8._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_e8._M_head_impl = (CExpression *)0x0;
    if ((CTempExpression *)local_a8._16_8_ != (CTempExpression *)0x0) {
      (*(((CExpression *)local_a8._16_8_)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_a8._16_8_ = 0;
    if (local_e0._M_head_impl != (CStatement *)0x0) {
      (*((local_e0._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_e0._M_head_impl = (CStatement *)0x0;
    if ((long *)local_110._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_110._M_p + 0x10))();
    }
    if ((CMoveStatement *)local_d0._M_head_impl != (CMoveStatement *)0x0) {
      (*((INode *)&((local_d0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_d0._M_head_impl = (CStatement *)0x0;
    if (local_80._M_head_impl != (CExpression *)0x0) {
      (*((local_80._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_80._M_head_impl = (CExpression *)0x0;
    if ((long *)local_108._M_allocated_capacity != (long *)0x0) {
      (**(code **)(*(long *)local_108._M_allocated_capacity + 0x10))();
    }
    if ((CTempExpression *)local_d8._M_head_impl != (CTempExpression *)0x0) {
      (*(((CExpression *)&(local_d8._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_d8._M_head_impl = (CExpression *)0x0;
    if ((CStatement *)local_58._0_8_ != (CStatement *)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_);
    }
  }
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const IRT::CStatement> IRT::CEseqFloatVisitor::processRightEseqInCJump(
        const IRT::CJumpConditionalStatement *cjump,
        const IRT::CExpression *left, const IRT::CEseqExpression *rightEseq) {

    if (isExpCommuteWithStm(left, rightEseq->getStatement())) {
        return SMOVE_UNIQ(new CSeqStatement(
                std::move(rightEseq->getStatement()->Copy()),
                SMOVE_UNIQ(new CJumpConditionalStatement(
                        cjump->Operation(),
                        std::move(left->Copy()),
                        std::move(rightEseq->getExpression()->Copy()),
                        std::move(cjump->TrueLabel()->CastCopy()),
                        std::move(cjump->FalseLabel()->CastCopy())
                ))
        ));
    } else {
        CTemp temp;
        return SMOVE_UNIQ(new CSeqStatement(
                SMOVE_UNIQ(new CMoveStatement(
                        EMOVE_UNIQ(new CTempExpression(temp)),
                        std::move(left->Copy())
                )),
                SMOVE_UNIQ(new CSeqStatement(
                        std::move(rightEseq->getStatement()->Copy()),
                        SMOVE_UNIQ(new CJumpConditionalStatement(
                                cjump->Operation(),
                                EMOVE_UNIQ(new CMemExpression(EMOVE_UNIQ(new CTempExpression(temp)))),
                                std::move(rightEseq->getExpression()->Copy()),
                                std::move(cjump->TrueLabel()->CastCopy()),
                                std::move(cjump->FalseLabel()->CastCopy())
                        ))
                ))
        ));
    }
}